

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_axis.cpp
# Opt level: O1

void __thiscall
chrono::ChFunctionRotation_axis::ChFunctionRotation_axis(ChFunctionRotation_axis *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChFunction *__tmp;
  
  (this->super_ChFunctionRotation)._vptr_ChFunctionRotation =
       (_func_int **)&PTR__ChFunctionRotation_axis_00b6ead8;
  (this->fangle).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fangle).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->axis).m_data[0] = 0.0;
  (this->axis).m_data[1] = 0.0;
  (this->axis).m_data[2] = 0.0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  (this->fangle).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  this_00 = (this->fangle).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->fangle).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (this != (ChFunctionRotation_axis *)&VECT_Y) {
    (this->axis).m_data[0] = VECT_Z;
    (this->axis).m_data[1] = DAT_00b90b08;
    (this->axis).m_data[2] = DAT_00b90b10;
  }
  return;
}

Assistant:

ChFunctionRotation_axis::ChFunctionRotation_axis() {

	// default s(t) function. User will provide better fx.
    this->fangle = chrono_types::make_shared<ChFunction_Const>(0);
	this->axis = VECT_Z;
}